

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

void __thiscall
OpenMD::StringTokenizer::StringTokenizer
          (StringTokenizer *this,const_iterator *first,const_iterator *last,string *delim)

{
  allocator<char> *paVar1;
  string *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  allocator<char> *in_RDI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_31;
  
  local_31._9_8_ = *in_RSI;
  local_31._1_8_ = *in_RDX;
  this_00 = &local_31;
  paVar1 = in_RDI;
  local_31.field_2._1_8_ = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (this_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::string((string *)(in_RDI + 0x20),(string *)local_31.field_2._1_8_);
  in_RDI[0x40] = (allocator<char>)0x0;
  paVar1 = in_RDI + 0x48;
  std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)paVar1,in_stack_ffffffffffffff78);
  std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)paVar1,in_stack_ffffffffffffff78);
  return;
}

Assistant:

StringTokenizer::StringTokenizer(std::string::const_iterator& first,
                                   std::string::const_iterator& last,
                                   const std::string& delim) :
      tokenString_(first, last),
      delim_(delim), returnTokens_(false), currentPos_(tokenString_.begin()),
      end_(tokenString_.end()) {}